

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicHandleInfo.hpp
# Opt level: O0

void __thiscall helics::BasicHandleInfo::BasicHandleInfo(BasicHandleInfo *this)

{
  GlobalHandle *in_RDI;
  GlobalHandle *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  
  memset(in_RDI,0,8);
  GlobalHandle::GlobalHandle(in_RDI);
  this_00 = in_RDI + 1;
  memset(this_00,0,4);
  LocalFederateId::LocalFederateId((LocalFederateId *)this_00);
  *(undefined1 *)&in_RDI[1].handle.hid = 0x75;
  *(undefined1 *)((long)&in_RDI[1].handle.hid + 1) = 0;
  *(undefined2 *)((long)&in_RDI[1].handle.hid + 2) = 0;
  std::__cxx11::string::string(unaff_retaddr);
  std::__cxx11::string::string(unaff_retaddr);
  std::__cxx11::string::string(unaff_retaddr);
  in_RDI[0xe] = (GlobalHandle)(in_RDI + 6);
  in_RDI[0xf] = (GlobalHandle)(in_RDI + 10);
  CLI::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x56eeda);
  return;
}

Assistant:

BasicHandleInfo() noexcept: type_in(type), type_out(units) {}